

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runsuite.c
# Opt level: O0

int xsdIncorrectTestCase(xmlNodePtr cur)

{
  int iVar1;
  undefined4 uVar2;
  int iVar3;
  xmlNodePtr cur_00;
  xmlNodePtr pxVar4;
  undefined8 uVar5;
  long lVar6;
  long lVar7;
  uint local_3c;
  int memt;
  int ret;
  xmlRelaxNGPtr rng;
  xmlRelaxNGParserCtxtPtr pctxt;
  xmlBufferPtr buf;
  xmlNodePtr test;
  xmlNodePtr cur_local;
  
  cur_00 = getNext(cur,"./incorrect[1]");
  if (cur_00 == (xmlNodePtr)0x0) {
    cur_local._4_4_ = 0;
  }
  else {
    pxVar4 = getNext(cur_00,"./*");
    if (pxVar4 == (xmlNodePtr)0x0) {
      uVar5 = xmlGetLineNo(cur_00);
      test_log("Failed to find test in correct line %ld\n",uVar5);
      cur_local._4_4_ = 1;
    }
    else {
      iVar1 = xmlMemUsed();
      lVar6 = xmlBufferCreate();
      if (lVar6 == 0) {
        fprintf(_stderr,"out of memory !\n");
        fatalError();
      }
      xmlBufferSetAllocationScheme(lVar6,0);
      xmlNodeDump(lVar6,pxVar4->doc,pxVar4,0);
      uVar5 = xmlBufferContent(lVar6);
      uVar2 = xmlBufferLength(lVar6);
      uVar5 = xmlRelaxNGNewMemParserCtxt(uVar5,uVar2);
      xmlRelaxNGSetParserErrors(uVar5,testErrorHandler,testErrorHandler,uVar5);
      xmlRelaxNGSetResourceLoader(uVar5,testResourceLoader,0);
      lVar7 = xmlRelaxNGParse(uVar5);
      xmlRelaxNGFreeParserCtxt(uVar5);
      if (lVar7 != 0) {
        uVar5 = xmlGetLineNo(pxVar4);
        test_log("Failed to detect incorrect RNG line %ld\n",uVar5);
      }
      local_3c = (uint)(lVar7 != 0);
      if (lVar6 != 0) {
        xmlBufferFree(lVar6);
      }
      if (lVar7 != 0) {
        xmlRelaxNGFree(lVar7);
      }
      xmlResetLastError();
      iVar3 = xmlMemUsed();
      if (iVar1 != iVar3) {
        uVar5 = xmlGetLineNo(cur_00);
        iVar3 = xmlMemUsed();
        test_log("Validation of tests starting line %ld leaked %d\n",uVar5,
                 (ulong)(uint)(iVar3 - iVar1));
        nb_leaks = nb_leaks + 1;
      }
      cur_local._4_4_ = local_3c;
    }
  }
  return cur_local._4_4_;
}

Assistant:

static int
xsdIncorrectTestCase(xmlNodePtr cur) {
    xmlNodePtr test;
    xmlBufferPtr buf;
    xmlRelaxNGParserCtxtPtr pctxt;
    xmlRelaxNGPtr rng = NULL;
    int ret = 0, memt;

    cur = getNext(cur, "./incorrect[1]");
    if (cur == NULL) {
        return(0);
    }

    test = getNext(cur, "./*");
    if (test == NULL) {
        test_log("Failed to find test in correct line %ld\n",
	        xmlGetLineNo(cur));
        return(1);
    }

    memt = xmlMemUsed();
    /*
     * dump the schemas to a buffer, then reparse it and compile the schemas
     */
    buf = xmlBufferCreate();
    if (buf == NULL) {
        fprintf(stderr, "out of memory !\n");
	fatalError();
    }
    xmlBufferSetAllocationScheme(buf, XML_BUFFER_ALLOC_DOUBLEIT);
    xmlNodeDump(buf, test->doc, test, 0, 0);
    pctxt = xmlRelaxNGNewMemParserCtxt(
            (const char *) xmlBufferContent(buf), xmlBufferLength(buf));
    xmlRelaxNGSetParserErrors(pctxt, testErrorHandler, testErrorHandler,
            pctxt);
    xmlRelaxNGSetResourceLoader(pctxt, testResourceLoader, NULL);
    rng = xmlRelaxNGParse(pctxt);
    xmlRelaxNGFreeParserCtxt(pctxt);
    if (rng != NULL) {
	test_log("Failed to detect incorrect RNG line %ld\n",
		    xmlGetLineNo(test));
        ret = 1;
	goto done;
    }

done:
    if (buf != NULL)
	xmlBufferFree(buf);
    if (rng != NULL)
        xmlRelaxNGFree(rng);
    xmlResetLastError();
    if (memt != xmlMemUsed()) {
	test_log("Validation of tests starting line %ld leaked %d\n",
		xmlGetLineNo(cur), xmlMemUsed() - memt);
	nb_leaks++;
    }
    return(ret);
}